

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_unsignedShort(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  Status myStatus_14;
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_iv_1 [7];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_v_1 [7];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char lex_v_ran_v_1_canrep [6];
  char lex_v_ran_iv_1_canrep [6];
  char data_rawstr_2 [9];
  char data_rawstr_1 [15];
  char lex_v_ran_v_0 [12];
  StrX local_d8;
  char *local_c8;
  char local_ba [4];
  char local_b6 [2];
  Status local_b4;
  char local_ae [2];
  undefined4 local_ac;
  undefined3 uStack_a8;
  char local_a4 [4];
  char local_a0 [8];
  char local_98 [8];
  undefined8 local_90;
  undefined2 local_88;
  char local_84 [8];
  char local_7c [8];
  char local_74 [8];
  char local_6c [8];
  int local_64;
  char local_60 [16];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"    1234  \n",0xc);
  builtin_strncpy(local_a0,"+65535",7);
  local_b6[0] = '0';
  local_b6[1] = '\0';
  local_ac = 0x3535362b;
  uStack_a8 = 0x3633;
  local_ba[2] = 0;
  local_ba[0] = '-';
  local_ba[1] = '1';
  builtin_strncpy(local_74,"65535",6);
  local_ae[0] = '0';
  local_ae[1] = '\0';
  builtin_strncpy(local_6c,"65536",6);
  local_a4[2] = 0;
  local_a4[0] = '-';
  local_a4[1] = '1';
  local_88 = 0x36;
  local_90 = 0x35342e3433623231;
  builtin_strncpy(local_98,"1234b56",8);
  builtin_strncpy(local_50,"    +12345   \n",0xf);
  builtin_strncpy(local_7c,"12345",6);
  builtin_strncpy(local_60,"00012345",9);
  builtin_strncpy(local_84,"12345",6);
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb09,local_40,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0a,local_a0,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0b,local_b6,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb0e,&local_ac,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00119c8d;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0e,&local_ac,local_d8.fLocalForm,0);
LAB_00119c8d:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb0f,local_ba,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00119d81;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0f,local_ba,local_d8.fLocalForm,0);
LAB_00119d81:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb12,&local_90,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00119e75;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb12,&local_90,local_d8.fLocalForm,0);
LAB_00119e75:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb13,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00119f69;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb13,local_98,local_d8.fLocalForm,0);
LAB_00119f69:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_64 = iVar9;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb30,local_40);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(ushort *)(pXVar3 + 8);
      if (*(ushort *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",pvVar7,
               0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_64;
    bVar10 = local_64 == 1;
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb32,local_a0);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(ushort *)(pXVar3 + 8);
      if (*(ushort *)(pXVar3 + 8) != 0xffff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",pvVar7,
               0xffff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb33,local_b6);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(ushort *)(pXVar3 + 8);
      if (*(ushort *)(pXVar3 + 8) != 0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",pvVar7,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb34,&local_ac,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      pvVar7 = (void *)0xb34;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb34,&local_ac);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb35,local_ba,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      pvVar7 = (void *)0xb35;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb35,local_ba);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb37,&local_90,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      pvVar7 = (void *)0xb37;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb37,&local_90);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 1
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb38,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      pvVar7 = (void *)0xb38;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb38,local_98);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_b4 = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb56,local_50);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_7c;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_0011a761:
          if (*pcVar8 == '\0') goto LAB_0011a7ae;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011a761;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb56,local_50,local_d8.fLocalForm,local_c8,local_7c);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_0011a7ae:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_b4 = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb57,local_60);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_84;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_0011a8a5:
          if (*pcVar8 == '\0') goto LAB_0011a8ef;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011a8a5;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb57,local_60,local_d8.fLocalForm,local_c8,local_84);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_0011a8ef:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_b4 = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb59,local_a0);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_74;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_0011a9e6:
          if (*pcVar8 == '\0') goto LAB_0011aa30;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011a9e6;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb59,local_a0,local_d8.fLocalForm,local_c8,local_74);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_0011aa30:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_b4 = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5a,local_b6);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_ae;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_0011ab2c:
          if (*pcVar8 == '\0') goto LAB_0011ab76;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011ab2c;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb5a,local_b6,local_d8.fLocalForm,local_c8,local_ae);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_0011ab76:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (lVar6 == 0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xb5c,&local_90,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        goto LAB_0011ac90;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5c,&local_90);
      StrX::~StrX(&local_d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011ac90:
      errSeen = 1;
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (lVar6 == 0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xb5d,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        goto LAB_0011ad98;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5d,local_98);
      StrX::~StrX(&local_d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011ad98:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (lVar6 == 0) {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb62,&local_ac,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_d8);
      goto LAB_0011aeb3;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb62,&local_ac);
    StrX::~StrX(&local_d8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011aeb3:
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d8.fUnicodeForm,dt_unsignedShort,(Status *)&local_c8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (lVar6 == 0) {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb63,local_ba,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_d8);
      goto LAB_0011afbe;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb63,local_ba);
    StrX::~StrX(&local_d8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011afbe:
    errSeen = 1;
  }
  local_b4 = st_Init;
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb66,&local_ac);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  else {
    local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_6c;
    if (local_c8 != pcVar8) {
      pcVar5 = local_c8;
      if (local_c8 == (char *)0x0) {
LAB_0011b098:
        if (*pcVar8 == '\0') goto LAB_0011b0e4;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_0011b098;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xb66,&local_ac,local_d8.fLocalForm,local_c8,local_6c);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
LAB_0011b0e4:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_b4 = st_Init;
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ba,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d8.fUnicodeForm,dt_unsignedShort,&local_b4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb67,local_ba,local_d8.fLocalForm);
    StrX::~StrX(&local_d8);
    errSeen = 1;
    return;
  }
  local_c8 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = local_a4;
  if (local_c8 != pcVar8) {
    pcVar5 = local_c8;
    if (local_c8 == (char *)0x0) {
LAB_0011b1d2:
      if (*pcVar8 == '\0') goto LAB_0011b21e;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_0011b1d2;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0xb67,local_ba,local_d8.fLocalForm,local_c8,local_a4);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
LAB_0011b21e:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_unsignedShort()
{
    const XSValue::DataType dt = XSValue::dt_unsignedShort;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234  \n";

    const char lex_v_ran_v_1[]="+65535";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+65536";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_ushort = (unsigned short)1234;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_ushort = (unsigned short)+65535;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_ushort = (unsigned short)0;

    const char lex_v_ran_v_1_canrep[]="65535";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="65536";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.23.2 Canonical representation
 *
 * The canonical representation for unsignedShort is defined by prohibiting certain options from the
 * Lexical representation (3.3.23.1). Specifically,
 * 1. the leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="    +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}